

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structure.cpp
# Opt level: O2

Structure * __thiscall polyscope::Structure::setTransparency(Structure *this,double newVal)

{
  double local_18;
  
  local_18 = newVal;
  PersistentValue<float>::operator=(&this->transparency,&local_18);
  if ((local_18 < 1.0) && (options::transparencyMode == 0)) {
    options::transparencyMode = 2;
  }
  requestRedraw();
  return this;
}

Assistant:

Structure* Structure::setTransparency(double newVal) {
  transparency = newVal;

  if (newVal < 1. && options::transparencyMode == TransparencyMode::None) {
    options::transparencyMode = TransparencyMode::Pretty;
  }
  requestRedraw();

  return this;
}